

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha224.c
# Opt level: O2

void SHA224_256ProcessMessageBlock(SHA256Context *context)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  uint32_t uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint32_t uVar15;
  uint uVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  int iVar19;
  uint auStack_178 [4];
  uint auStack_165 [4];
  int local_154 [5];
  uint local_140 [68];
  
  for (lVar9 = 0x2d; lVar9 != 0x6d; lVar9 = lVar9 + 4) {
    uVar1 = *(uint *)((long)context->Intermediate_Hash + lVar9 + -3);
    *(uint *)((long)auStack_165 + lVar9) =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  }
  for (lVar9 = 0x10; lVar9 != 0x40; lVar9 = lVar9 + 1) {
    uVar1 = local_140[lVar9];
    uVar2 = auStack_178[lVar9 + 1];
    local_140[lVar9 + 2] =
         (uVar1 >> 10 ^ (uVar1 << 0xd | uVar1 >> 0x13) ^ (uVar1 << 0xf | uVar1 >> 0x11)) +
         local_154[lVar9] + auStack_178[lVar9] +
         (uVar2 >> 3 ^ (uVar2 << 0xe | uVar2 >> 0x12) ^ (uVar2 << 0x19 | uVar2 >> 7));
  }
  uVar1 = context->Intermediate_Hash[1];
  uVar2 = context->Intermediate_Hash[2];
  uVar3 = context->Intermediate_Hash[3];
  uVar4 = context->Intermediate_Hash[4];
  uVar5 = context->Intermediate_Hash[5];
  uVar6 = context->Intermediate_Hash[6];
  uVar7 = context->Intermediate_Hash[7];
  uVar8 = uVar1;
  uVar10 = uVar2;
  uVar13 = uVar3;
  uVar17 = uVar4;
  uVar16 = uVar5;
  uVar11 = uVar6;
  uVar18 = uVar7;
  uVar15 = context->Intermediate_Hash[0];
  for (lVar9 = 0; uVar14 = uVar11, uVar11 = uVar16, uVar16 = uVar17, uVar12 = uVar10, uVar10 = uVar8
      , lVar9 != 0x100; lVar9 = lVar9 + 4) {
    iVar19 = uVar18 + ((uVar11 ^ uVar14) & uVar16 ^ uVar14) +
             ((uVar16 << 7 | uVar16 >> 0x19) ^
             (uVar16 << 0x15 | uVar16 >> 0xb) ^ (uVar16 << 0x1a | uVar16 >> 6)) +
             *(int *)((long)SHA224_256ProcessMessageBlock::K + lVar9) +
             *(int *)((long)local_140 + lVar9 + 8);
    uVar17 = uVar13 + iVar19;
    uVar8 = uVar15;
    uVar13 = uVar12;
    uVar18 = uVar14;
    uVar15 = (uVar12 & uVar10 ^ (uVar12 ^ uVar10) & uVar15) +
             ((uVar15 << 10 | uVar15 >> 0x16) ^
             (uVar15 << 0x13 | uVar15 >> 0xd) ^ (uVar15 << 0x1e | uVar15 >> 2)) + iVar19;
  }
  context->Intermediate_Hash[0] = uVar15 + context->Intermediate_Hash[0];
  context->Intermediate_Hash[1] = uVar10 + uVar1;
  context->Intermediate_Hash[2] = uVar12 + uVar2;
  context->Intermediate_Hash[3] = uVar13 + uVar3;
  context->Intermediate_Hash[4] = uVar16 + uVar4;
  context->Intermediate_Hash[5] = uVar11 + uVar5;
  context->Intermediate_Hash[6] = uVar14 + uVar6;
  context->Intermediate_Hash[7] = uVar18 + uVar7;
  context->Message_Block_Index = 0;
  return;
}

Assistant:

static void SHA224_256ProcessMessageBlock(SHA256Context *context)
{
    /* Constants defined in FIPS-180-2, section 4.2.2 */
    static const uint32_t K[64] = {
        0x428a2f98, 0x71374491, 0xb5c0fbcf, 0xe9b5dba5, 0x3956c25b,
        0x59f111f1, 0x923f82a4, 0xab1c5ed5, 0xd807aa98, 0x12835b01,
        0x243185be, 0x550c7dc3, 0x72be5d74, 0x80deb1fe, 0x9bdc06a7,
        0xc19bf174, 0xe49b69c1, 0xefbe4786, 0x0fc19dc6, 0x240ca1cc,
        0x2de92c6f, 0x4a7484aa, 0x5cb0a9dc, 0x76f988da, 0x983e5152,
        0xa831c66d, 0xb00327c8, 0xbf597fc7, 0xc6e00bf3, 0xd5a79147,
        0x06ca6351, 0x14292967, 0x27b70a85, 0x2e1b2138, 0x4d2c6dfc,
        0x53380d13, 0x650a7354, 0x766a0abb, 0x81c2c92e, 0x92722c85,
        0xa2bfe8a1, 0xa81a664b, 0xc24b8b70, 0xc76c51a3, 0xd192e819,
        0xd6990624, 0xf40e3585, 0x106aa070, 0x19a4c116, 0x1e376c08,
        0x2748774c, 0x34b0bcb5, 0x391c0cb3, 0x4ed8aa4a, 0x5b9cca4f,
        0x682e6ff3, 0x748f82ee, 0x78a5636f, 0x84c87814, 0x8cc70208,
        0x90befffa, 0xa4506ceb, 0xbef9a3f7, 0xc67178f2
    };
    int        t, t4;                   /* Loop counter */
    uint32_t   temp1, temp2;            /* Temporary word value */
    uint32_t   W[64];                   /* Word sequence */
    uint32_t   A, B, C, D, E, F, G, H;  /* Word buffers */

    /*
    * Initialize the first 16 words in the array W
    */
    for (t = t4 = 0; t < 16; t++, t4 += 4)
    {
        W[t] = (((uint32_t)context->Message_Block[t4]) << 24) |
            (((uint32_t)context->Message_Block[t4 + 1]) << 16) |
            (((uint32_t)context->Message_Block[t4 + 2]) << 8) |
            (((uint32_t)context->Message_Block[t4 + 3]));
    }
    for (t = 16; t < 64; t++)
    {
        W[t] = SHA256_sigma1(W[t - 2]) + W[t - 7] +
            SHA256_sigma0(W[t - 15]) + W[t - 16];
    }
    A = context->Intermediate_Hash[0];
    B = context->Intermediate_Hash[1];
    C = context->Intermediate_Hash[2];
    D = context->Intermediate_Hash[3];
    E = context->Intermediate_Hash[4];
    F = context->Intermediate_Hash[5];
    G = context->Intermediate_Hash[6];
    H = context->Intermediate_Hash[7];

    for (t = 0; t < 64; t++)
    {
        temp1 = H + SHA256_SIGMA1(E) + SHA_Ch(E, F, G) + K[t] + W[t];
        temp2 = SHA256_SIGMA0(A) + SHA_Maj(A, B, C);
        H = G;
        G = F;
        F = E;
        E = D + temp1;
        D = C;
        C = B;
        B = A;
        A = temp1 + temp2;
    }

    context->Intermediate_Hash[0] += A;
    context->Intermediate_Hash[1] += B;
    context->Intermediate_Hash[2] += C;
    context->Intermediate_Hash[3] += D;
    context->Intermediate_Hash[4] += E;
    context->Intermediate_Hash[5] += F;
    context->Intermediate_Hash[6] += G;
    context->Intermediate_Hash[7] += H;

    context->Message_Block_Index = 0;
}